

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeMemoryCopy
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name destMem,Name srcMem)

{
  Name sourceMemory;
  Name destMemory;
  MemoryCopy *pMVar1;
  bool bVar2;
  Ok local_109;
  IRBuilder *local_108;
  size_t local_100;
  char *local_f8;
  char *local_f0;
  uint local_e4;
  Err local_e0;
  Err *local_b0;
  Err *err;
  Result<wasm::Ok> _val;
  MemoryCopy curr;
  IRBuilder *this_local;
  Name srcMem_local;
  Name destMem_local;
  
  srcMem_local.super_IString.str._M_len = srcMem.super_IString.str._M_str;
  this_local = srcMem.super_IString.str._M_len;
  srcMem_local.super_IString.str._M_str = destMem.super_IString.str._M_len;
  pMVar1 = (MemoryCopy *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.sourceMemory.super_IString.str._M_str = (char *)this;
  MemoryCopy::MemoryCopy(pMVar1);
  wasm::Name::operator=((Name *)&curr.size,(Name *)&srcMem_local.super_IString.str._M_str);
  wasm::Name::operator=((Name *)&curr.destMemory.super_IString.str._M_str,(Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitMemoryCopy
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pMVar1);
  local_b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_b0 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_e0,local_b0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  local_e4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_e4 == 0) {
    local_f8 = srcMem_local.super_IString.str._M_str;
    local_108 = this_local;
    local_100 = srcMem_local.super_IString.str._M_len;
    destMemory.super_IString.str._M_str = destMem.super_IString.str._M_str;
    destMemory.super_IString.str._M_len = (size_t)srcMem_local.super_IString.str._M_str;
    sourceMemory.super_IString.str._M_str = (char *)srcMem_local.super_IString.str._M_len;
    sourceMemory.super_IString.str._M_len = (size_t)this_local;
    local_f0 = destMem.super_IString.str._M_str;
    pMVar1 = Builder::makeMemoryCopy
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)38>.super_Expression.
                        type.id,curr.dest,curr.source,destMemory,sourceMemory);
    push(this,(Expression *)pMVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_109);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeMemoryCopy(Name destMem, Name srcMem) {
  MemoryCopy curr;
  curr.destMemory = destMem;
  curr.sourceMemory = srcMem;
  CHECK_ERR(visitMemoryCopy(&curr));
  push(
    builder.makeMemoryCopy(curr.dest, curr.source, curr.size, destMem, srcMem));
  return Ok{};
}